

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O2

void anon_unknown.dwarf_6e813::createNegativeXEdge<double>
               (vector<double,_std::allocator<double>_> *data,
               vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *point,double x,
               double y)

{
  double *pdVar1;
  PointBase2D<double> local_30;
  
  for (pdVar1 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pdVar1 != (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish; pdVar1 = pdVar1 + 1) {
    local_30.x = x - *pdVar1;
    local_30.y = y;
    std::vector<PointBase2D<double>,std::allocator<PointBase2D<double>>>::
    emplace_back<PointBase2D<double>>
              ((vector<PointBase2D<double>,std::allocator<PointBase2D<double>>> *)point,&local_30);
  }
  return;
}

Assistant:

void createNegativeXEdge( const std::vector< _Type > & data, std::vector < PointBase2D<_Type> > & point, _Type x, _Type y )
    {
        for ( typename std::vector <_Type>::const_iterator dataX = data.cbegin(); dataX != data.cend(); ++dataX )
            point.push_back( PointBase2D<_Type>( x - (*dataX), y ) );
    }